

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

void slang::ast::findIfaces
               (ClassType *type,SmallVectorBase<const_slang::ast::Type_*> *ifaces,
               SmallSet<const_slang::ast::Symbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
               *visited)

{
  undefined1 *puVar1;
  char *pcVar2;
  pointer ppTVar3;
  undefined4 uVar4;
  size_t sVar5;
  Type *this;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  SmallSet<const_slang::ast::Symbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
  *pSVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  pointer ppTVar16;
  bool bVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Type *iface;
  locator res;
  ClassType *local_70;
  undefined8 local_68;
  arrays_type *local_60;
  SmallSet<const_slang::ast::Symbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_32UL,_16UL>_>
  *local_58;
  ClassType *local_50;
  locator local_48;
  
  if (type->isInterface == true) {
    puVar1 = &(visited->super_Storage).field_0x28;
    local_68 = *(undefined8 *)&(visited->super_Storage).field_0x28;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = type;
    uVar12 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar9 = uVar12 >> (visited->field_0x30 & 0x3f);
    uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar12 & 0xff];
    uVar10 = 0;
    uVar15 = uVar9;
    do {
      pcVar2 = (char *)(*(long *)&visited->field_0x40 + uVar15 * 0x10);
      cVar18 = (char)uVar4;
      auVar22[0] = -(*pcVar2 == cVar18);
      cVar19 = (char)((uint)uVar4 >> 8);
      auVar22[1] = -(pcVar2[1] == cVar19);
      cVar20 = (char)((uint)uVar4 >> 0x10);
      auVar22[2] = -(pcVar2[2] == cVar20);
      cVar21 = (char)((uint)uVar4 >> 0x18);
      auVar22[3] = -(pcVar2[3] == cVar21);
      auVar22[4] = -(pcVar2[4] == cVar18);
      auVar22[5] = -(pcVar2[5] == cVar19);
      auVar22[6] = -(pcVar2[6] == cVar20);
      auVar22[7] = -(pcVar2[7] == cVar21);
      auVar22[8] = -(pcVar2[8] == cVar18);
      auVar22[9] = -(pcVar2[9] == cVar19);
      auVar22[10] = -(pcVar2[10] == cVar20);
      auVar22[0xb] = -(pcVar2[0xb] == cVar21);
      auVar22[0xc] = -(pcVar2[0xc] == cVar18);
      auVar22[0xd] = -(pcVar2[0xd] == cVar19);
      auVar22[0xe] = -(pcVar2[0xe] == cVar20);
      auVar22[0xf] = -(pcVar2[0xf] == cVar21);
      uVar13 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
      if (uVar13 != 0) {
        lVar14 = *(long *)&visited->field_0x48 + uVar15 * 0x78;
        do {
          uVar6 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          if (*(ClassType **)(lVar14 + (ulong)uVar6 * 8) == type) {
            bVar17 = lVar14 + (ulong)uVar6 * 8 == 0;
            goto LAB_001f2bd6;
          }
          uVar13 = uVar13 - 1 & uVar13;
        } while (uVar13 != 0);
      }
      bVar17 = true;
      if ((*(byte *)(uVar15 * 0x10 + *(long *)&visited->field_0x40 + 0xf) &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7]) == 0) break;
      lVar14 = uVar15 + uVar10;
      uVar10 = uVar10 + 1;
      uVar15 = lVar14 + 1U & *(ulong *)&visited->field_0x38;
    } while (uVar10 <= *(ulong *)&visited->field_0x38);
LAB_001f2bd6:
    local_70 = type;
    if (bVar17) {
      if (*(ulong *)&visited->field_0x58 < *(ulong *)&visited->field_0x50) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
        ::nosize_unchecked_emplace_at<slang::ast::Symbol_const*>
                  (&local_48,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                    *)puVar1,(arrays_type *)&visited->field_0x30,uVar9,uVar12,(Symbol **)&local_70);
        *(long *)&visited->field_0x58 = *(long *)&visited->field_0x58 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
        ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*>
                  (&local_48,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                    *)puVar1,uVar12,(Symbol **)&local_70);
      }
      if (bVar17) {
        local_48.pg = (group15<boost::unordered::detail::foa::plain_integral> *)type;
        SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                  ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_48);
      }
    }
  }
  if ((type->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&type->super_Scope);
  }
  sVar5 = (type->implementsIfaces)._M_extent._M_extent_value;
  if (sVar5 != 0) {
    ppTVar16 = (type->implementsIfaces)._M_ptr;
    ppTVar3 = ppTVar16 + sVar5;
    puVar1 = &(visited->super_Storage).field_0x28;
    local_60 = (arrays_type *)&visited->field_0x30;
    pSVar11 = visited;
    local_58 = visited;
    do {
      visited = local_58;
      local_70 = (ClassType *)*ppTVar16;
      local_68 = *(undefined8 *)&(pSVar11->super_Storage).field_0x28;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_70;
      uVar12 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar9 = uVar12 >> (pSVar11->field_0x30 & 0x3f);
      uVar4 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar12 & 0xff];
      uVar10 = 0;
      uVar15 = uVar9;
      do {
        pcVar2 = (char *)(*(long *)&pSVar11->field_0x40 + uVar15 * 0x10);
        cVar18 = (char)uVar4;
        auVar23[0] = -(*pcVar2 == cVar18);
        cVar19 = (char)((uint)uVar4 >> 8);
        auVar23[1] = -(pcVar2[1] == cVar19);
        cVar20 = (char)((uint)uVar4 >> 0x10);
        auVar23[2] = -(pcVar2[2] == cVar20);
        cVar21 = (char)((uint)uVar4 >> 0x18);
        auVar23[3] = -(pcVar2[3] == cVar21);
        auVar23[4] = -(pcVar2[4] == cVar18);
        auVar23[5] = -(pcVar2[5] == cVar19);
        auVar23[6] = -(pcVar2[6] == cVar20);
        auVar23[7] = -(pcVar2[7] == cVar21);
        auVar23[8] = -(pcVar2[8] == cVar18);
        auVar23[9] = -(pcVar2[9] == cVar19);
        auVar23[10] = -(pcVar2[10] == cVar20);
        auVar23[0xb] = -(pcVar2[0xb] == cVar21);
        auVar23[0xc] = -(pcVar2[0xc] == cVar18);
        auVar23[0xd] = -(pcVar2[0xd] == cVar19);
        auVar23[0xe] = -(pcVar2[0xe] == cVar20);
        auVar23[0xf] = -(pcVar2[0xf] == cVar21);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
        if (uVar13 != 0) {
          lVar14 = *(long *)&pSVar11->field_0x48 + uVar15 * 0x78;
          do {
            uVar6 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            if (local_70 == *(ClassType **)(lVar14 + (ulong)uVar6 * 8)) {
              lVar14 = lVar14 + (ulong)uVar6 * 8;
              goto LAB_001f2d64;
            }
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
        }
        if ((*(byte *)(uVar15 * 0x10 + *(long *)&pSVar11->field_0x40 + 0xf) &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7]) == 0) break;
        lVar14 = uVar15 + uVar10;
        uVar10 = uVar10 + 1;
        uVar15 = lVar14 + 1U & *(ulong *)&pSVar11->field_0x38;
      } while (uVar10 <= *(ulong *)&pSVar11->field_0x38);
      lVar14 = 0;
LAB_001f2d64:
      local_50 = local_70;
      if (lVar14 == 0) {
        if (*(ulong *)&local_58->field_0x58 < *(ulong *)&local_58->field_0x50) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
          ::nosize_unchecked_emplace_at<slang::ast::Symbol_const*>
                    (&local_48,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                      *)puVar1,local_60,uVar9,uVar12,(Symbol **)&local_70);
          *(long *)&visited->field_0x58 = *(long *)&visited->field_0x58 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*>
                    (&local_48,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,32ul,16ul>>
                      *)puVar1,uVar12,(Symbol **)&local_70);
        }
        SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*const&>
                  ((SmallVectorBase<slang::ast::Type_const*> *)ifaces,(Type **)&local_50);
      }
      ppTVar16 = ppTVar16 + 1;
      pSVar11 = visited;
    } while (ppTVar16 != ppTVar3);
  }
  if ((type->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&type->super_Scope);
  }
  this = type->baseClass;
  if (this != (Type *)0x0) {
    if (this->canonical == (Type *)0x0) {
      Type::resolveCanonical(this);
    }
    if ((this->canonical->super_Symbol).kind != ErrorType) {
      findIfaces((ClassType *)this->canonical,ifaces,visited);
    }
  }
  return;
}

Assistant:

static void findIfaces(const ClassType& type, SmallVectorBase<const Type*>& ifaces,
                       SmallSet<const Symbol*, 4>& visited) {
    if (type.isInterface) {
        if (visited.emplace(&type).second)
            ifaces.push_back(&type);
    }

    for (auto iface : type.getImplementedInterfaces()) {
        if (visited.emplace(iface).second)
            ifaces.push_back(iface);
    }

    if (auto base = type.getBaseClass(); base && !base->isError())
        findIfaces(base->getCanonicalType().as<ClassType>(), ifaces, visited);
}